

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_lambda.cpp
# Opt level: O2

void duckdb::ExtractParameters
               (LambdaExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *column_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *column_aliases)

{
  BinderException *this;
  vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> *__range1;
  reference_wrapper<duckdb::ParsedExpression> *column_ref;
  vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> column_refs;
  string error_message;
  
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  error_message._M_string_length = 0;
  error_message.field_2._M_local_buf[0] = '\0';
  LambdaExpression::ExtractColumnRefExpressions(&column_refs,expr,&error_message);
  if (error_message._M_string_length != 0) {
    this = (BinderException *)__cxa_allocate_exception(0x10);
    BinderException::BinderException(this,&error_message);
    __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  for (; column_refs.
         super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         column_refs.
         super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      column_refs.
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           column_refs.
           super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    ExtractParameter((column_refs.
                      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_data,column_names,
                     column_aliases);
  }
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                   *)&column_refs);
  ::std::__cxx11::string::~string((string *)&error_message);
  return;
}

Assistant:

void ExtractParameters(LambdaExpression &expr, vector<string> &column_names, vector<string> &column_aliases) {

	// extract the lambda parameters, which are a single column
	// reference, or a list of column references (ROW function)
	string error_message;
	auto column_refs = expr.ExtractColumnRefExpressions(error_message);
	if (!error_message.empty()) {
		throw BinderException(error_message);
	}

	for (const auto &column_ref : column_refs) {
		ExtractParameter(column_ref.get(), column_names, column_aliases);
	}
	D_ASSERT(!column_names.empty());
}